

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

void __thiscall Jinx::Variant::SetBuffer(Variant *this,BufferPtr *value)

{
  Destroy(this);
  this->m_type = Buffer;
  (this->field_1).m_number = 0.0;
  (this->field_1).m_string._M_string_length = 0;
  std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> *)&(this->field_1).m_string,
             &value->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

inline_t void Variant::SetBuffer(const BufferPtr & value)
	{
		Destroy();
		if (!value)
		{
			m_type = ValueType::Null;
			m_integer = 0;
		}
		m_type = ValueType::Buffer;
		new(&m_buffer) BufferPtr();
		m_buffer = value;
	}